

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slot.hpp
# Opt level: O0

Result_t __thiscall
sig::Slot<void(int),std::function<void(int)>>::operator()
          (Slot<void(int),std::function<void(int)>> *this,int *args)

{
  bool bVar1;
  undefined1 local_30 [8];
  Locked_container_t l;
  int *args_local;
  Slot<void_(int),_std::function<void_(int)>_> *this_local;
  
  l.super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)args;
  bVar1 = Slot_base::expired((Slot_base *)this);
  if (!bVar1) {
    Slot_base::lock((Locked_container_t *)local_30,(Slot_base *)this);
    std::function<void_(int)>::operator()
              ((function<void_(int)> *)(this + 0x20),
               *(int *)&((l.
                          super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                        super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::~vector
              ((vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> *)local_30);
  }
  return;
}

Assistant:

Result_t operator()(Arguments&&... args) const {
        if (this->expired()) {
            return Result_t();
        }
        auto l = this->lock();
        return function_(std::forward<Arguments>(args)...);
    }